

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O0

int trico_read_triangles(void *a,uint32_t **triangles)

{
  trico_stream_type tVar1;
  int iVar2;
  ssize_t sVar3;
  char *pcVar4;
  uint8_t *b1;
  uint8_t *b2;
  uint8_t *b3;
  uint8_t *b4;
  uint8_t *decompressed_b4;
  uint8_t *decompressed_b3;
  uint8_t *decompressed_b2;
  uint32_t bytes_decompressed;
  uint8_t *decompressed_b1;
  void *compressed;
  uint32_t nr_of_compressed_bytes;
  uint32_t nr_of_triangles;
  trico_archive *arch;
  uint32_t **triangles_local;
  void *a_local;
  
  _nr_of_compressed_bytes = (trico_archive *)a;
  arch = (trico_archive *)triangles;
  triangles_local = (uint32_t **)a;
  tVar1 = trico_get_next_stream_type(a);
  if (tVar1 == trico_triangle_uint32_stream) {
    sVar3 = read((int)&compressed + 4,(void *)0x4,1);
    if ((int)sVar3 == 0) {
      a_local._4_4_ = 0;
    }
    else {
      sVar3 = read((int)&compressed,(void *)0x4,1);
      if ((int)sVar3 == 0) {
        a_local._4_4_ = 0;
      }
      else {
        pcVar4 = (char *)trico_malloc((ulong)(uint)compressed);
        sVar3 = read((int)pcVar4,(void *)0x1,(ulong)(uint)compressed);
        if ((int)sVar3 == 0) {
          a_local._4_4_ = 0;
        }
        else {
          b1 = (uint8_t *)trico_malloc((ulong)(uint)(compressed._4_4_ * 3));
          iVar2 = LZ4_decompress_safe(pcVar4,(char *)b1,(uint)compressed,compressed._4_4_ * 3);
          if (iVar2 != compressed._4_4_ * 3) {
            __assert_fail("bytes_decompressed == nr_of_triangles * 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                          ,0x44e,"int trico_read_triangles(void *, uint32_t **)");
          }
          sVar3 = read((int)&compressed,(void *)0x4,1);
          if ((int)sVar3 == 0) {
            a_local._4_4_ = 0;
          }
          else {
            pcVar4 = (char *)trico_realloc(pcVar4,(ulong)(uint)compressed);
            sVar3 = read((int)pcVar4,(void *)0x1,(ulong)(uint)compressed);
            if ((int)sVar3 == 0) {
              a_local._4_4_ = 0;
            }
            else {
              b2 = (uint8_t *)trico_malloc((ulong)(uint)(compressed._4_4_ * 3));
              iVar2 = LZ4_decompress_safe(pcVar4,(char *)b2,(uint)compressed,compressed._4_4_ * 3);
              if (iVar2 != compressed._4_4_ * 3) {
                __assert_fail("bytes_decompressed == nr_of_triangles * 3",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                              ,0x457,"int trico_read_triangles(void *, uint32_t **)");
              }
              sVar3 = read((int)&compressed,(void *)0x4,1);
              if ((int)sVar3 == 0) {
                a_local._4_4_ = 0;
              }
              else {
                pcVar4 = (char *)trico_realloc(pcVar4,(ulong)(uint)compressed);
                sVar3 = read((int)pcVar4,(void *)0x1,(ulong)(uint)compressed);
                if ((int)sVar3 == 0) {
                  a_local._4_4_ = 0;
                }
                else {
                  b3 = (uint8_t *)trico_malloc((ulong)(uint)(compressed._4_4_ * 3));
                  iVar2 = LZ4_decompress_safe(pcVar4,(char *)b3,(uint)compressed,
                                              compressed._4_4_ * 3);
                  if (iVar2 != compressed._4_4_ * 3) {
                    __assert_fail("bytes_decompressed == nr_of_triangles * 3",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                  ,0x460,"int trico_read_triangles(void *, uint32_t **)");
                  }
                  sVar3 = read((int)&compressed,(void *)0x4,1);
                  if ((int)sVar3 == 0) {
                    a_local._4_4_ = 0;
                  }
                  else {
                    pcVar4 = (char *)trico_realloc(pcVar4,(ulong)(uint)compressed);
                    sVar3 = read((int)pcVar4,(void *)0x1,(ulong)(uint)compressed);
                    if ((int)sVar3 == 0) {
                      a_local._4_4_ = 0;
                    }
                    else {
                      b4 = (uint8_t *)trico_malloc((ulong)(uint)(compressed._4_4_ * 3));
                      iVar2 = LZ4_decompress_safe(pcVar4,(char *)b4,(uint)compressed,
                                                  compressed._4_4_ * 3);
                      if (iVar2 != compressed._4_4_ * 3) {
                        __assert_fail("bytes_decompressed == nr_of_triangles * 3",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                      ,0x469,"int trico_read_triangles(void *, uint32_t **)");
                      }
                      if (arch != (trico_archive *)0x0) {
                        trico_transpose_uint32_soa_to_aos
                                  ((uint32_t **)arch,b1,b2,b3,b4,compressed._4_4_ * 3);
                      }
                      trico_free(pcVar4);
                      trico_free(b1);
                      trico_free(b2);
                      trico_free(b3);
                      trico_free(b4);
                      read_next_stream_type(_nr_of_compressed_bytes);
                      a_local._4_4_ = 1;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

int trico_read_triangles(void* a, uint32_t** triangles)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  if (trico_get_next_stream_type(arch) != trico_triangle_uint32_stream)
    return 0;

  uint32_t nr_of_triangles;
  if (!read(&nr_of_triangles, sizeof(uint32_t), 1, arch))
    return 0;

  uint32_t nr_of_compressed_bytes;
  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  void* compressed = trico_malloc(nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b1 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  uint32_t bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b1, nr_of_compressed_bytes, nr_of_triangles * 3);
  assert(bytes_decompressed == nr_of_triangles * 3);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b2 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b2, nr_of_compressed_bytes, nr_of_triangles * 3);
  assert(bytes_decompressed == nr_of_triangles * 3);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b3 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b3, nr_of_compressed_bytes, nr_of_triangles * 3);
  assert(bytes_decompressed == nr_of_triangles * 3);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b4 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b4, nr_of_compressed_bytes, nr_of_triangles * 3);
  assert(bytes_decompressed == nr_of_triangles * 3);

  if (triangles != NULL)
    trico_transpose_uint32_soa_to_aos(triangles, decompressed_b1, decompressed_b2, decompressed_b3, decompressed_b4, nr_of_triangles * 3);

  trico_free(compressed);
  trico_free(decompressed_b1);
  trico_free(decompressed_b2);
  trico_free(decompressed_b3);
  trico_free(decompressed_b4);

  read_next_stream_type(arch);

  return 1;
  }